

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::MessageHints::RequestHintOnFieldNumbers
          (MessageHints *this,Message *reason,ErrorLocation reason_location,int range_start,
          int range_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  anon_class_1_0_00000001 local_25;
  int local_24;
  int iStack_20;
  anon_class_1_0_00000001 fit;
  int range_end_local;
  int range_start_local;
  ErrorLocation reason_location_local;
  Message *reason_local;
  MessageHints *this_local;
  
  iVar3 = this->fields_to_suggest;
  local_24 = range_end;
  iStack_20 = range_start;
  iVar1 = RequestHintOnFieldNumbers::anon_class_1_0_00000001::operator()(&local_25,range_end);
  iVar2 = RequestHintOnFieldNumbers::anon_class_1_0_00000001::operator()(&local_25,iStack_20);
  iVar1 = RequestHintOnFieldNumbers::anon_class_1_0_00000001::operator()(&local_25,iVar1 - iVar2);
  iVar3 = RequestHintOnFieldNumbers::anon_class_1_0_00000001::operator()(&local_25,iVar3 + iVar1);
  this->fields_to_suggest = iVar3;
  if (this->first_reason == (Message *)0x0) {
    this->first_reason = reason;
    this->first_reason_location = reason_location;
  }
  return;
}

Assistant:

void RequestHintOnFieldNumbers(
        const Message& reason,
        DescriptorPool::ErrorCollector::ErrorLocation reason_location,
        int range_start = 0, int range_end = 1) {
      auto fit = [](int value) {
        return std::min(std::max(value, 0), FieldDescriptor::kMaxNumber);
      };
      fields_to_suggest =
          fit(fields_to_suggest + fit(fit(range_end) - fit(range_start)));
      if (first_reason) return;
      first_reason = &reason;
      first_reason_location = reason_location;
    }